

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseDenseProduct.h
# Opt level: O2

void Eigen::internal::
     sparse_time_dense_product_impl<Eigen::SparseMatrix<double,_0,_int>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_double,_0,_true>
     ::run(SparseMatrix<double,_0,_int> *lhs,Matrix<double,__1,_1,_0,__1,_1> *rhs,
          Matrix<double,__1,_1,_0,__1,_1> *res,double *alpha)

{
  double *pdVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  Index j;
  long outer;
  long lStack_70;
  undefined1 local_68 [8];
  LhsInnerIterator it;
  
  bVar2 = true;
  lStack_70 = 0;
  while (bVar2) {
    for (outer = 0; outer < lhs->m_outerSize; outer = outer + 1) {
      it.m_end = (Index)(*alpha * (rhs->
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                  m_storage.m_data
                                  [(rhs->
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                   m_storage.m_rows * lStack_70 + outer]);
      SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::InnerIterator
                ((InnerIterator *)local_68,
                 &lhs->super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>,outer);
      lVar3 = (res->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              * lStack_70;
      pdVar1 = (res->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      for (; it.m_outer.m_value < it.m_id; it.m_outer.m_value = it.m_outer.m_value + 1) {
        lVar4 = (long)*(int *)((long)it.m_values + it.m_outer.m_value * 4);
        pdVar1[lVar3 + lVar4] =
             *(double *)((long)local_68 + it.m_outer.m_value * 8) * (double)it.m_end +
             pdVar1[lVar3 + lVar4];
      }
    }
    bVar2 = false;
    lStack_70 = 1;
  }
  return;
}

Assistant:

static void run(const SparseLhsType& lhs, const DenseRhsType& rhs, DenseResType& res, const AlphaType& alpha)
  {
    LhsEval lhsEval(lhs);
    for(Index c=0; c<rhs.cols(); ++c)
    {
      for(Index j=0; j<lhs.outerSize(); ++j)
      {
//        typename Res::Scalar rhs_j = alpha * rhs.coeff(j,c);
        typename ScalarBinaryOpTraits<AlphaType, typename Rhs::Scalar>::ReturnType rhs_j(alpha * rhs.coeff(j,c));
        for(LhsInnerIterator it(lhsEval,j); it ;++it)
          res.coeffRef(it.index(),c) += it.value() * rhs_j;
      }
    }
  }